

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_shdr_chunk.cpp
# Opt level: O2

void __thiscall sf2cute::SFRIFFShdrChunk::Write(SFRIFFShdrChunk *this,ostream *out)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ostream *poVar3;
  undefined8 uVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  length_error *this_00;
  out_of_range *this_01;
  ulong uVar7;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  ulong uVar8;
  element_type *peVar9;
  ulong uVar10;
  ulong uVar11;
  pointer psVar12;
  mapped_type link;
  key_type local_70;
  ostream *local_68;
  undefined4 local_5c;
  undefined1 local_58 [40];
  
  local_5c = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x1c);
  std::ios::exceptions((int)out + (int)*(long *)(*(long *)out + -0x18));
  local_68 = out;
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(local_58,this);
  RIFFChunk::WriteHeader(out,(string *)local_58,this->size_);
  std::__cxx11::string::~string((string *)local_58);
  psVar12 = (this->samples_->
            super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->samples_->
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0;
  __to = extraout_RDX;
  local_58._32_8_ = this;
  while( true ) {
    if (psVar12 == psVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"EOS",(allocator<char> *)&local_70);
      poVar3 = local_68;
      WriteItem(local_68,(string *)local_58,0,0,0,0,0,'\0','\0',0,0);
      uVar4 = local_58._32_8_;
      std::__cxx11::string::~string((string *)local_58);
      if ((*(size_type *)(uVar4 + 8) & 1) != 0) {
        std::operator<<(poVar3,'\0');
      }
      return;
    }
    peVar9 = (psVar12->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (peVar9->link_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
      link = 0;
    }
    else {
      SFSample::link((SFSample *)local_58,(char *)peVar9,__to);
      local_70 = (key_type)local_58._0_8_;
      sVar5 = std::
              _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->sample_index_map_)._M_h,&local_70);
      if (sVar5 == 0) {
        this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_01,"Sample has a link to an unknown sample.");
        __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      local_70 = (key_type)local_58._0_8_;
      pmVar6 = std::__detail::
               _Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->sample_index_map_,&local_70);
      link = *pmVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      peVar9 = (psVar12->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    uVar7 = ((long)(peVar9->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             *(long *)&(peVar9->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data >> 1) + uVar8;
    uVar10 = peVar9->start_loop_ + uVar8;
    if (((uVar10 | uVar8 | uVar7) >> 0x20 != 0) ||
       (uVar11 = peVar9->end_loop_ + uVar8, uVar11 >> 0x20 != 0)) break;
    WriteItem(local_68,&peVar9->name_,(uint32_t)uVar8,(uint32_t)uVar7,(uint32_t)uVar10,
              (uint32_t)uVar11,peVar9->sample_rate_,peVar9->original_key_,peVar9->correction_,link,
              peVar9->type_);
    peVar9 = (psVar12->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar8 = uVar8 + ((long)(peVar9->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(peVar9->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl
                           .super__Vector_impl_data._M_start >> 1) + 0x2e;
    psVar12 = psVar12 + 1;
    __to = extraout_RDX_00;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"Too many sample datapoints.");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void SFRIFFShdrChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Sample headers:
    size_t start_sample = 0;
    for (const auto & sample : samples()) {
      // Find the linked sample.
      uint16_t link_index = 0;
      if (sample->has_link()) {
        const auto & link = sample->link();
        if (sample_index_map().count(link.get()) != 0) {
          link_index = sample_index_map().at(link.get());
        }
        else {
          throw std::out_of_range("Sample has a link to an unknown sample.");
        }
      }

      // Calculate the sample indices.
      size_t end_sample = start_sample + sample->data().size();
      size_t start_loop = start_sample + sample->start_loop();
      size_t end_loop = start_sample + sample->end_loop();

      // Check the range of indices.
      if (start_sample > UINT32_MAX || end_sample > UINT32_MAX ||
          start_loop > UINT32_MAX || end_loop > UINT32_MAX) {
        throw std::length_error("Too many sample datapoints.");
      }

      // Write the sample header.
      WriteItem(out,
        sample->name(),
        uint32_t(start_sample),
        uint32_t(end_sample),
        uint32_t(start_loop),
        uint32_t(end_loop),
        sample->sample_rate(),
        sample->original_key(),
        sample->correction(),
        link_index,
        sample->type());

      // Calculate the next sample index.
      start_sample += sample->data().size() + SFSample::kTerminatorSampleLength;
    }

    // Write the last terminator item.
    WriteItem(out, "EOS", 0, 0, 0, 0, 0, 0, 0, 0, SFSampleLink(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}